

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.h
# Opt level: O2

unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
 __thiscall
tonk::
MakeUniqueNoThrow<asio::basic_datagram_socket<asio::ip::udp,asio::datagram_socket_service<asio::ip::udp>>,asio::io_context&>
          (tonk *this,io_context *args)

{
  basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *this_00;
  
  this_00 = (basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *)
            operator_new(0x20,(nothrow_t *)&std::nothrow);
  if (this_00 != (basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> *)0x0) {
    asio::basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true>::basic_io_object
              (this_00,args);
  }
  *(basic_io_object<asio::datagram_socket_service<asio::ip::udp>,_true> **)this = this_00;
  return (__uniq_ptr_data<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>,_true,_true>
          )(__uniq_ptr_data<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<T> MakeUniqueNoThrow(Args&&... args) {
    return std::unique_ptr<T>(new(std::nothrow) T(std::forward<Args>(args)...));
}